

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void print_CFG(gen_ctx_t gen_ctx,int bb_p,int pressure_p,int insns_p,int insn_index_p,
              _func_void_gen_ctx_t_bb_t *bb_info_print_func)

{
  bb_t_conflict bb_00;
  bb_insn_t_conflict local_48;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t insn;
  bb_t_conflict insn_bb;
  bb_t_conflict bb;
  _func_void_gen_ctx_t_bb_t *bb_info_print_func_local;
  int insn_index_p_local;
  int insns_p_local;
  int pressure_p_local;
  int bb_p_local;
  gen_ctx_t gen_ctx_local;
  
  if (gen_ctx->optimize_level == 0) {
    insn_bb = (bb_t_conflict)0x0;
    for (bb_insn = (bb_insn_t_conflict)
                   DLIST_MIR_insn_t_head(&((gen_ctx->curr_func_item->u).func)->insns);
        bb_insn != (bb_insn_t_conflict)0x0;
        bb_insn = (bb_insn_t_conflict)DLIST_MIR_insn_t_next((MIR_insn_t)bb_insn)) {
      if ((bb_p != 0) && (bb_00 = get_insn_data_bb((MIR_insn_t)bb_insn), bb_00 != insn_bb)) {
        fprintf((FILE *)gen_ctx->debug_file,"BB %3lu:\n",bb_00->index);
        output_in_edges(gen_ctx,bb_00);
        output_out_edges(gen_ctx,bb_00);
        insn_bb = bb_00;
        if (bb_info_print_func != (_func_void_gen_ctx_t_bb_t *)0x0) {
          (*bb_info_print_func)(gen_ctx,bb_00);
          fprintf((FILE *)gen_ctx->debug_file,"\n");
        }
      }
      if (insns_p != 0) {
        MIR_output_insn(gen_ctx->ctx,gen_ctx->debug_file,(MIR_insn_t_conflict)bb_insn,
                        (gen_ctx->curr_func_item->u).func,1);
      }
    }
  }
  else {
    for (insn_bb = DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs); insn_bb != (bb_t_conflict)0x0;
        insn_bb = DLIST_bb_t_next(insn_bb)) {
      if (bb_p != 0) {
        fprintf((FILE *)gen_ctx->debug_file,"BB %3lu",insn_bb->index);
        if (pressure_p != 0) {
          fprintf((FILE *)gen_ctx->debug_file," (pressure: int=%d, fp=%d)",
                  (ulong)(uint)insn_bb->max_int_pressure,(ulong)(uint)insn_bb->max_fp_pressure);
        }
        if (insn_bb->loop_node == (loop_node_t_conflict)0x0) {
          fprintf((FILE *)gen_ctx->debug_file,"\n");
        }
        else {
          fprintf((FILE *)gen_ctx->debug_file," (loop%3lu):\n",
                  (ulong)insn_bb->loop_node->parent->index);
        }
        output_in_edges(gen_ctx,insn_bb);
        output_out_edges(gen_ctx,insn_bb);
        if (bb_info_print_func != (_func_void_gen_ctx_t_bb_t *)0x0) {
          (*bb_info_print_func)(gen_ctx,insn_bb);
          fprintf((FILE *)gen_ctx->debug_file,"\n");
        }
      }
      if (insns_p != 0) {
        for (local_48 = DLIST_bb_insn_t_head(&insn_bb->bb_insns);
            local_48 != (bb_insn_t_conflict)0x0; local_48 = DLIST_bb_insn_t_next(local_48)) {
          if (insn_index_p != 0) {
            fprintf((FILE *)gen_ctx->debug_file,"  %-5lu",(ulong)local_48->index);
          }
          print_bb_insn(gen_ctx,local_48,1);
        }
        fprintf((FILE *)gen_ctx->debug_file,"\n");
      }
    }
  }
  return;
}

Assistant:

static void print_CFG (gen_ctx_t gen_ctx, int bb_p, int pressure_p, int insns_p, int insn_index_p,
                       void (*bb_info_print_func) (gen_ctx_t, bb_t)) {
  bb_t bb, insn_bb;

  if (optimize_level == 0) {
    bb = NULL;
    for (MIR_insn_t insn = DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns); insn != NULL;
         insn = DLIST_NEXT (MIR_insn_t, insn)) {
      if (bb_p && (insn_bb = get_insn_data_bb (insn)) != bb) {
        bb = insn_bb;
        fprintf (debug_file, "BB %3lu:\n", (unsigned long) bb->index);
        output_in_edges (gen_ctx, bb);
        output_out_edges (gen_ctx, bb);
        if (bb_info_print_func != NULL) {
          bb_info_print_func (gen_ctx, bb);
          fprintf (debug_file, "\n");
        }
      }
      if (insns_p) MIR_output_insn (gen_ctx->ctx, debug_file, insn, curr_func_item->u.func, TRUE);
    }
    return;
  }
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    if (bb_p) {
      fprintf (debug_file, "BB %3lu", (unsigned long) bb->index);
      if (pressure_p)
        fprintf (debug_file, " (pressure: int=%d, fp=%d)", bb->max_int_pressure,
                 bb->max_fp_pressure);
      if (bb->loop_node == NULL)
        fprintf (debug_file, "\n");
      else
        fprintf (debug_file, " (loop%3lu):\n", (unsigned long) bb->loop_node->parent->index);
      output_in_edges (gen_ctx, bb);
      output_out_edges (gen_ctx, bb);
      if (bb_info_print_func != NULL) {
        bb_info_print_func (gen_ctx, bb);
        fprintf (debug_file, "\n");
      }
    }
    if (insns_p) {
      for (bb_insn_t bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
           bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
        if (insn_index_p) fprintf (debug_file, "  %-5lu", (unsigned long) bb_insn->index);
        print_bb_insn (gen_ctx, bb_insn, TRUE);
      }
      fprintf (debug_file, "\n");
    }
  }
}